

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O2

void internal_convert_record
               (IOConversionPtr conv,ConvStatus conv_status,void *src,void *dest,
               int data_already_copied)

{
  int iVar1;
  FMTypeEnum FVar2;
  FMdata_type FVar3;
  FMFormat_conflict p_Var4;
  FMVarInfoList var;
  ulong uVar5;
  size_t sVar6;
  size_t *__ptr;
  long lVar7;
  ulong uVar8;
  long lVar9;
  FMTypeDesc *pFVar10;
  IOconvFieldStruct *conv_00;
  void *dest_field;
  char *dest_field_addr;
  char *src_field_addr;
  _FMgetFieldStruct local_48;
  
  if (conv->conversion_type == none_required) {
    return;
  }
  conv_00 = conv->conversions;
  __ptr = (size_t *)0x0;
  for (lVar9 = 0; uVar5 = (ulong)conv->conv_count, lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
    for (pFVar10 = &(conv->conversions[lVar9].iovar)->type_desc; pFVar10 != (FMTypeDesc *)0x0;
        pFVar10 = pFVar10->next) {
      if ((pFVar10->type == FMType_array) && (pFVar10->static_size == 0)) {
        p_Var4 = conv->ioformat->body;
        local_48.size = p_Var4->field_list[pFVar10->control_field_index].field_size;
        local_48.offset = (size_t)p_Var4->field_list[pFVar10->control_field_index].field_offset;
        local_48.data_type = integer_type;
        local_48._17_7_ = 0;
        local_48.byte_swap = (byte)p_Var4->byte_reversal;
        sVar6 = get_big_int(&local_48,src);
        if (__ptr == (size_t *)0x0) {
          __ptr = (size_t *)ffs_malloc((long)p_Var4->field_count << 3);
          uVar5 = (ulong)(uint)p_Var4->field_count;
          if (p_Var4->field_count < 1) {
            uVar5 = 0;
          }
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            __ptr[uVar8] = 0;
          }
          conv_status->control_value = __ptr;
        }
        __ptr[pFVar10->control_field_index] = sVar6;
      }
    }
  }
  lVar9 = 0;
  do {
    if ((int)uVar5 <= lVar9) {
      free(__ptr);
      return;
    }
    var = conv_00->iovar;
    lVar7 = get_static_array_element_count(var);
    src_field_addr = (char *)((conv_00->src_field).offset + (long)src);
    dest_field_addr = (char *)(conv_00->dest_offset + (long)dest);
    if (conv_00->default_value == (void *)0x0) {
      iVar1 = (conv_00->src_field).size;
      if (((((iVar1 != 1) && ((conv_00->src_field).byte_swap != '\0')) ||
           (iVar1 != conv_00->dest_size)) ||
          ((conv_00->subconversion != (IOConversionPtr)0x0 ||
           (FVar2 = (var->type_desc).type, FVar2 == FMType_pointer)))) ||
         (((int)lVar7 == -1 || FVar2 == FMType_string || (conv_00->rc_swap != no_row_column_swap))))
      goto LAB_0011056e;
      FVar3 = (conv_00->src_field).data_type;
      if (FVar3 == string_type) {
        if (conv_status->dest_pointer_base == (void *)0x0) goto LAB_001105eb;
        goto LAB_0011056e;
      }
      if ((FVar3 == float_type) &&
         ((conv_00->src_field).src_float_format != (conv_00->src_field).target_float_format))
      goto LAB_0011056e;
LAB_001105eb:
      memcpy(dest_field_addr,src_field_addr,(long)(iVar1 * (int)lVar7));
    }
    else {
      memcpy(dest_field_addr,conv_00->default_value,(long)conv_00->dest_size);
LAB_0011056e:
      new_convert_field(src_field_addr,dest_field_addr,conv_status,conv_00,&var->type_desc,1);
    }
    lVar9 = lVar9 + 1;
    uVar5 = (ulong)(uint)conv->conv_count;
    conv_00 = conv_00 + 1;
  } while( true );
}

Assistant:

static void
internal_convert_record(IOConversionPtr conv, ConvStatus conv_status, void *src,
			void *dest, int data_already_copied)
{
    int i;
    size_t *control_value = NULL;
    if (conv->conversion_type == none_required) return;
    for (i = 0; i < conv->conv_count; i++) {
	FMTypeDesc *next = &conv->conversions[i].iovar->type_desc;
	while (next != NULL) {
	    if ((next->type == FMType_array) && 
		(next->static_size == 0)) {
		size_t elements;
		FMFormat f = conv->ioformat->body;
		int field = next->control_field_index;
		struct _FMgetFieldStruct tmp_src_spec;
		memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
		tmp_src_spec.size = f->field_list[field].field_size;
		tmp_src_spec.offset = f->field_list[field].field_offset;
		tmp_src_spec.data_type = integer_type;
		tmp_src_spec.byte_swap = conv->ioformat->body->byte_reversal;
		elements = get_big_int(&tmp_src_spec, src);
		if (control_value == NULL) {
		    int j;
		    control_value = (size_t *) malloc(sizeof(control_value[0]) * f->field_count);
		    for (j = 0; j < f->field_count; j++)
			control_value[j] = 0;
		    conv_status->control_value = control_value;
		}
		control_value[next->control_field_index] = elements;
	    }
	    next = next->next;
	}
    }
    for (i = 0; i < conv->conv_count; i++) {
	FMFieldPtr src_spec = &conv->conversions[i].src_field;
	FMTypeDesc *type_desc = &conv->conversions[i].iovar->type_desc;
	int elements = get_static_array_element_count(conv->conversions[i].iovar);
	int byte_swap = conv->conversions[i].src_field.byte_swap;
	char *src_field_addr = (char*)src + src_spec->offset;
	char *dest_field_addr = (char*)dest + conv->conversions[i].dest_offset;

	if (conv->conversions[i].src_field.size == 1) byte_swap = 0;
	if (conv->conversions[i].default_value){
	    void *dest_field = (void *) (conv->conversions[i].dest_offset + 
					 (char *) dest);
	    memcpy(dest_field, conv->conversions[i].default_value, 
		   conv->conversions[i].dest_size);
	} else if (!byte_swap &&
		   (src_spec->size == conv->conversions[i].dest_size) &&
		   (conv->conversions[i].subconversion == NULL) &&
		   (type_desc->type != FMType_pointer) &&
		   (type_desc->type != FMType_string) &&
		   (elements != -1 /* var array */) &&
		   (conv->conversions[i].rc_swap == no_row_column_swap) &&
		   ((src_spec->data_type != float_type) || 
		    (src_spec->src_float_format == src_spec->target_float_format)) &&
		   ((src_spec->data_type != string_type) || 
		    ((conv_status->dest_pointer_base) == NULL))) {
	    /* data movement is all that is required */
	    memcpy(dest_field_addr, src_field_addr,
		   src_spec->size * elements);
	    continue;
	}
	new_convert_field(src_field_addr, dest_field_addr, conv_status, 
			  &conv->conversions[i], type_desc, 1);
    }
    if (control_value != NULL) {
	free(control_value);
    }
}